

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

bool llvm::sys::path::user_cache_directory
               (SmallVectorImpl<char> *Result,Twine *Path1,Twine *Path2,Twine *Path3)

{
  bool bVar1;
  char *__s;
  size_t sVar2;
  Twine local_90;
  Twine local_78;
  Twine local_60;
  Twine local_48;
  
  __s = getenv("XDG_CACHE_HOME");
  if (__s == (char *)0x0) {
    bVar1 = home_directory(Result);
    if (!bVar1) {
      return false;
    }
    Twine::Twine(&local_90,".cache");
    Twine::Twine(&local_60,"");
    Twine::Twine(&local_78,"");
    Twine::Twine(&local_48,"");
    append(Result,&local_90,&local_60,&local_78,&local_48);
  }
  else {
    (Result->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = 0;
    sVar2 = strlen(__s);
    SmallVectorImpl<char>::append<char_const*,void>(Result,__s,__s + sVar2);
  }
  Twine::Twine(&local_90,"");
  append(Result,Path1,Path2,Path3,&local_90);
  return true;
}

Assistant:

bool user_cache_directory(SmallVectorImpl<char> &Result, const Twine &Path1,
                          const Twine &Path2, const Twine &Path3) {
  if (getUserCacheDir(Result)) {
    append(Result, Path1, Path2, Path3);
    return true;
  }
  return false;
}